

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qprogressbar.cpp
# Opt level: O1

void QProgressBar::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined1 *puVar1;
  byte bVar2;
  byte *pbVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  QArrayData *pQVar7;
  undefined4 *puVar8;
  QString *format;
  QProgressBarPrivate *this;
  byte bVar9;
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  long in_FS_OFFSET;
  undefined4 local_5c;
  QArrayData *local_58;
  undefined4 *puStack_50;
  long local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    local_5c = *_a[1];
    puStack_50 = &local_5c;
    local_58 = (QArrayData *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,0,&local_58);
    break;
  case 1:
    *(int *)(*(long *)(_o + 8) + 0x25c) = *(int *)(*(long *)(_o + 8) + 0x254) + -1;
    QWidget::repaint((QWidget *)_o);
    break;
  case 2:
    iVar11 = *_a[2];
    iVar12 = *_a[1];
    goto LAB_00472539;
  case 3:
    iVar12 = *_a[1];
    iVar11 = *(int *)(*(long *)(_o + 8) + 600);
    if (*(int *)(*(long *)(_o + 8) + 600) <= iVar12) {
      iVar11 = iVar12;
    }
    goto LAB_00472539;
  case 4:
    iVar11 = *_a[1];
    iVar12 = *(int *)(*(long *)(_o + 8) + 0x254);
    if (iVar11 <= *(int *)(*(long *)(_o + 8) + 0x254)) {
      iVar12 = iVar11;
    }
LAB_00472539:
    setRange((QProgressBar *)_o,iVar12,iVar11);
    break;
  case 5:
    setValue((QProgressBar *)_o,*_a[1]);
    break;
  case 6:
    setOrientation((QProgressBar *)_o,*_a[1]);
  }
  if (_c != ReadProperty) {
    if (_c == WriteProperty) goto switchD_004724a3_caseD_2;
    if (_c == IndexOfMethod) {
      if ((*_a[1] == valueChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
        *(undefined4 *)*_a = 0;
        goto LAB_0047281b;
      }
      if (_c == WriteProperty) goto switchD_004724a3_caseD_2;
      if (_c == ReadProperty) goto switchD_004724a3_caseD_1;
    }
    goto switchD_004724a3_caseD_3;
  }
switchD_004724a3_caseD_1:
  if (9 < (uint)_id) goto LAB_00472714;
  pbVar3 = (byte *)*_a;
  switch(_id) {
  case 0:
    uVar10 = *(undefined4 *)(*(long *)(_o + 8) + 0x254);
    break;
  case 1:
    uVar10 = *(undefined4 *)(*(long *)(_o + 8) + 600);
    break;
  case 2:
    (**(code **)(*(long *)_o + 0x1a0))(&local_58,_o);
    pQVar7 = *(QArrayData **)pbVar3;
    *(QArrayData **)pbVar3 = local_58;
    puVar8 = *(undefined4 **)(pbVar3 + 8);
    *(undefined4 **)(pbVar3 + 8) = puStack_50;
    lVar4 = *(long *)(pbVar3 + 0x10);
    *(long *)(pbVar3 + 0x10) = local_48;
    local_58 = pQVar7;
    puStack_50 = puVar8;
    local_48 = lVar4;
    if (pQVar7 != (QArrayData *)0x0) {
      LOCK();
      (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      iVar11 = (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
joined_r0x00472655:
      if (iVar11 == 0) {
        QArrayData::deallocate(pQVar7,2,0x10);
      }
    }
    goto LAB_00472714;
  case 3:
    uVar10 = *(undefined4 *)(*(long *)(_o + 8) + 0x25c);
    break;
  case 4:
    uVar10 = *(undefined4 *)(*(long *)(_o + 8) + 0x260);
    break;
  case 5:
    bVar9 = *(byte *)(*(long *)(_o + 8) + 0x264) & 1;
    goto LAB_004726f4;
  case 6:
    uVar10 = *(undefined4 *)(*(long *)(_o + 8) + 0x26c);
    break;
  case 7:
    bVar9 = *(byte *)(*(long *)(_o + 8) + 0x270);
LAB_004726f4:
    *pbVar3 = bVar9;
    goto LAB_00472714;
  case 8:
    uVar10 = *(undefined4 *)(*(long *)(_o + 8) + 0x274);
    break;
  case 9:
    lVar4 = *(long *)(_o + 8);
    piVar5 = *(int **)(lVar4 + 0x278);
    lVar6 = *(long *)(lVar4 + 0x280);
    lVar4 = *(long *)(lVar4 + 0x288);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    pQVar7 = *(QArrayData **)pbVar3;
    *(int **)pbVar3 = piVar5;
    *(long *)(pbVar3 + 8) = lVar6;
    *(long *)(pbVar3 + 0x10) = lVar4;
    if (pQVar7 != (QArrayData *)0x0) {
      LOCK();
      (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      iVar11 = (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      goto joined_r0x00472655;
    }
    goto LAB_00472714;
  }
  *(undefined4 *)pbVar3 = uVar10;
LAB_00472714:
  if (_c != WriteProperty) goto switchD_004724a3_caseD_3;
switchD_004724a3_caseD_2:
  if (9 < (uint)_id) goto switchD_004724a3_caseD_3;
  format = (QString *)*_a;
  switch(_id) {
  case 0:
    iVar11 = *(int *)&(format->d).d;
    iVar12 = *(int *)(*(long *)(_o + 8) + 600);
    if (*(int *)(*(long *)(_o + 8) + 600) <= iVar11) {
      iVar12 = iVar11;
    }
    goto LAB_0047277f;
  case 1:
    iVar12 = *(int *)&(format->d).d;
    iVar11 = *(int *)(*(long *)(_o + 8) + 0x254);
    if (iVar12 <= *(int *)(*(long *)(_o + 8) + 0x254)) {
      iVar11 = iVar12;
    }
LAB_0047277f:
    setRange((QProgressBar *)_o,iVar11,iVar12);
    break;
  case 3:
    setValue((QProgressBar *)_o,*(int *)&(format->d).d);
    break;
  case 4:
    iVar11 = *(int *)&(format->d).d;
    if (*(int *)(*(long *)(_o + 8) + 0x260) != iVar11) {
      *(int *)(*(long *)(_o + 8) + 0x260) = iVar11;
LAB_004727e5:
      QWidget::repaint((QWidget *)_o);
    }
    break;
  case 5:
    bVar9 = *(byte *)&(format->d).d;
    bVar2 = *(byte *)(*(long *)(_o + 8) + 0x264);
    if (((bVar2 ^ bVar9) & 1) != 0) {
      *(byte *)(*(long *)(_o + 8) + 0x264) = bVar2 & 0xfe | bVar9;
      goto LAB_004727e5;
    }
    break;
  case 6:
    setOrientation((QProgressBar *)_o,*(Orientation *)&(format->d).d);
    break;
  case 7:
    *(undefined1 *)(*(long *)(_o + 8) + 0x270) = *(undefined1 *)&(format->d).d;
    goto LAB_004727a3;
  case 8:
    *(undefined4 *)(*(long *)(_o + 8) + 0x274) = *(undefined4 *)&(format->d).d;
LAB_004727a3:
    QWidget::update((QWidget *)_o);
    break;
  case 9:
    setFormat((QProgressBar *)_o,format);
  }
switchD_004724a3_caseD_3:
  if (_id == 9 && _c == ResetProperty) {
    this = *(QProgressBarPrivate **)(_o + 8);
    puVar1 = &this->field_0x264;
    *puVar1 = *puVar1 | 2;
    QProgressBarPrivate::initDefaultFormat(this);
    QWidget::update((QWidget *)_o);
  }
LAB_0047281b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QProgressBar::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QProgressBar *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->valueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->reset(); break;
        case 2: _t->setRange((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: _t->setMinimum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->setMaximum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->setValue((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->setOrientation((*reinterpret_cast< std::add_pointer_t<Qt::Orientation>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QProgressBar::*)(int )>(_a, &QProgressBar::valueChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->minimum(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->maximum(); break;
        case 2: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->value(); break;
        case 4: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isTextVisible(); break;
        case 6: *reinterpret_cast<Qt::Orientation*>(_v) = _t->orientation(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->invertedAppearance(); break;
        case 8: *reinterpret_cast<Direction*>(_v) = _t->textDirection(); break;
        case 9: *reinterpret_cast<QString*>(_v) = _t->format(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setMinimum(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setMaximum(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setValue(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 5: _t->setTextVisible(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setOrientation(*reinterpret_cast<Qt::Orientation*>(_v)); break;
        case 7: _t->setInvertedAppearance(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setTextDirection(*reinterpret_cast<Direction*>(_v)); break;
        case 9: _t->setFormat(*reinterpret_cast<QString*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 9: _t->resetFormat(); break;
        default: break;
        }
    }
}